

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

HeapType __thiscall wasm::Type::getHeapType(Type *this)

{
  ulong uVar1;
  
  uVar1 = this->id;
  if (uVar1 < 7) {
    getBasic(this);
    handle_unreachable("Unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x45d);
  }
  if (*(int *)(uVar1 + 4) == 1) {
    return (HeapType)*(uintptr_t *)(uVar1 + 8);
  }
  handle_unreachable("Unexpected type",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                     ,0x466);
}

Assistant:

HeapType Type::getHeapType() const {
  if (isBasic()) {
    switch (getBasic()) {
      case Type::none:
      case Type::unreachable:
      case Type::i32:
      case Type::i64:
      case Type::f32:
      case Type::f64:
      case Type::v128:
        break;
    }
    WASM_UNREACHABLE("Unexpected type");
  } else {
    auto* info = getTypeInfo(*this);
    switch (info->kind) {
      case TypeInfo::TupleKind:
        break;
      case TypeInfo::RefKind:
        return info->ref.heapType;
    }
    WASM_UNREACHABLE("Unexpected type");
  }
}